

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  domain_error *pdVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar7;
  undefined1 local_2a0 [8];
  ostringstream oss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined8 uStack_280;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  size_t local_258;
  string local_128;
  SourceLineInfo local_108;
  string local_e0;
  SourceLineInfo *local_c0;
  string local_b8;
  TagAliasRegistry *local_98;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  char *local_40;
  allocator local_32;
  allocator local_31;
  
  local_98 = this;
  local_40 = alias;
  std::__cxx11::string::string((string *)local_2a0,alias,&local_32);
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"[@","");
  bVar3 = startsWith((string *)local_2a0,(string *)local_90);
  bVar4 = true;
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_b8,local_40,&local_31);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"]","");
    bVar4 = endsWith(&local_b8,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    bVar4 = !bVar4;
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  if (local_2a0 != (undefined1  [8])&local_290) {
    operator_delete((void *)local_2a0);
  }
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"error: tag alias, \"",0x13);
    poVar5 = std::operator<<((ostream *)local_2a0,local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" is not of the form [@alias name].\n",0x24);
    operator<<(poVar5,lineInfo);
    pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(pdVar6,(char *)local_90._0_8_);
    __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::string((string *)&local_128,tag,(allocator *)&local_b8);
  paVar1 = &local_108.file.field_2;
  pcVar2 = (lineInfo->file)._M_dataplus._M_p;
  local_108.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar2,pcVar2 + (lineInfo->file)._M_string_length);
  local_108.line = lineInfo->line;
  local_c0 = lineInfo;
  TagAlias::TagAlias((TagAlias *)local_90,&local_128,&local_108);
  local_2a0 = (undefined1  [8])local_40;
  if ((undefined1 *)local_90._0_8_ == local_90 + 0x10) {
    uStack_280 = local_90._24_8_;
    _oss = local_290._M_local_buf + 8;
  }
  else {
    _oss = (pointer)local_90._0_8_;
  }
  local_290._M_allocated_capacity = local_90._8_8_;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p == &local_60) {
    local_268._8_8_ = local_60._8_8_;
    local_278._M_p = (pointer)&local_268;
  }
  else {
    local_278._M_p = local_70._M_p;
  }
  local_270 = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_258 = local_50;
  local_90._0_8_ = local_90 + 0x10;
  local_70._M_p = (pointer)&local_60;
  pVar7 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::_M_emplace_unique<std::pair<char_const*,Catch::TagAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                      *)&local_98->m_registry,(pair<const_char_*,_Catch::TagAlias> *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p);
  }
  if (_oss != local_290._M_local_buf + 8) {
    operator_delete(_oss);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"error: tag alias, \"",0x13);
  poVar5 = std::operator<<((ostream *)local_2a0,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" already registered.\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tFirst seen at ",0xf);
  std::__cxx11::string::string((string *)&local_b8,local_40,(allocator *)&local_e0);
  (*(local_98->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(local_90,local_98,&local_b8);
  operator<<(poVar5,(SourceLineInfo *)(local_90._0_8_ + 0x20));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tRedefined at ",0xe);
  operator<<(poVar5,local_c0);
  Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(pdVar6,(char *)local_90._0_8_);
  __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }